

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int yy_reserved(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  char *extraout_RDX_22;
  char *extraout_RDX_23;
  char *extraout_RDX_24;
  char *extraout_RDX_25;
  char *extraout_RDX_26;
  char *extraout_RDX_27;
  char *extraout_RDX_28;
  char *cclass;
  int yypos614;
  int yythunkpos614;
  int iVar5;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar3 = yymatchString(G,"True");
  iVar5 = 3;
  cclass = extraout_RDX;
  if (iVar3 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    iVar3 = yymatchString(G,"False");
    cclass = extraout_RDX_00;
    if (iVar3 == 0) {
      G->pos = iVar1;
      G->thunkpos = iVar2;
      iVar3 = yymatchString(G,"pi");
      cclass = extraout_RDX_01;
      if (iVar3 == 0) {
        G->pos = iVar1;
        G->thunkpos = iVar2;
        iVar3 = yymatchString(G,"my");
        cclass = extraout_RDX_02;
        if (iVar3 == 0) {
          G->pos = iVar1;
          G->thunkpos = iVar2;
          iVar3 = yymatchString(G,"our");
          cclass = extraout_RDX_03;
          if (iVar3 == 0) {
            G->pos = iVar1;
            G->thunkpos = iVar2;
            iVar3 = yymatchString(G,"until");
            cclass = extraout_RDX_04;
            if (iVar3 == 0) {
              G->pos = iVar1;
              G->thunkpos = iVar2;
              iVar3 = yymatchString(G,"while");
              cclass = extraout_RDX_05;
              if (iVar3 == 0) {
                G->pos = iVar1;
                G->thunkpos = iVar2;
                iVar3 = yymatchString(G,"unless");
                cclass = extraout_RDX_06;
                if (iVar3 == 0) {
                  G->pos = iVar1;
                  G->thunkpos = iVar2;
                  iVar3 = yymatchString(G,"if");
                  cclass = extraout_RDX_07;
                  if (iVar3 == 0) {
                    G->pos = iVar1;
                    G->thunkpos = iVar2;
                    iVar3 = yymatchString(G,"elsif");
                    cclass = extraout_RDX_08;
                    if (iVar3 == 0) {
                      G->pos = iVar1;
                      G->thunkpos = iVar2;
                      iVar3 = yymatchString(G,"else");
                      cclass = extraout_RDX_09;
                      if (iVar3 == 0) {
                        G->pos = iVar1;
                        G->thunkpos = iVar2;
                        iVar3 = yymatchString(G,"role");
                        cclass = extraout_RDX_10;
                        if (iVar3 == 0) {
                          G->pos = iVar1;
                          G->thunkpos = iVar2;
                          iVar3 = yymatchString(G,"class");
                          cclass = extraout_RDX_11;
                          if (iVar3 == 0) {
                            G->pos = iVar1;
                            G->thunkpos = iVar2;
                            iVar3 = yymatchString(G,"try");
                            cclass = extraout_RDX_12;
                            if (iVar3 == 0) {
                              G->pos = iVar1;
                              G->thunkpos = iVar2;
                              iVar3 = yymatchString(G,"has");
                              cclass = extraout_RDX_13;
                              if (iVar3 == 0) {
                                G->pos = iVar1;
                                G->thunkpos = iVar2;
                                iVar3 = yymatchString(G,"sub");
                                cclass = extraout_RDX_14;
                                if (iVar3 == 0) {
                                  G->pos = iVar1;
                                  G->thunkpos = iVar2;
                                  iVar3 = yymatchString(G,"cmp");
                                  cclass = extraout_RDX_15;
                                  if (iVar3 == 0) {
                                    G->pos = iVar1;
                                    G->thunkpos = iVar2;
                                    iVar3 = yymatchString(G,"enum");
                                    cclass = extraout_RDX_16;
                                    if (iVar3 == 0) {
                                      G->pos = iVar1;
                                      G->thunkpos = iVar2;
                                      iVar3 = yymatchChar(G,0x65);
                                      cclass = extraout_RDX_17;
                                      if (iVar3 == 0) {
                                        G->pos = iVar1;
                                        G->thunkpos = iVar2;
                                        iVar3 = yymatchString(G,"time");
                                        cclass = extraout_RDX_18;
                                        if (iVar3 == 0) {
                                          G->pos = iVar1;
                                          G->thunkpos = iVar2;
                                          iVar3 = yymatchString(G,"now");
                                          cclass = extraout_RDX_19;
                                          if (iVar3 == 0) {
                                            G->pos = iVar1;
                                            G->thunkpos = iVar2;
                                            iVar3 = yymatchString(G,"rand");
                                            cclass = extraout_RDX_20;
                                            if (iVar3 == 0) {
                                              G->pos = iVar1;
                                              G->thunkpos = iVar2;
                                              iVar3 = yymatchString(G,"END");
                                              cclass = extraout_RDX_21;
                                              if (iVar3 == 0) {
                                                G->pos = iVar1;
                                                G->thunkpos = iVar2;
                                                iVar3 = yymatchString(G,"BEGIN");
                                                cclass = extraout_RDX_22;
                                                if (iVar3 == 0) {
                                                  G->pos = iVar1;
                                                  G->thunkpos = iVar2;
                                                  iVar3 = yymatchChar(G,0x5a);
                                                  cclass = extraout_RDX_23;
                                                  if (iVar3 == 0) {
                                                    G->pos = iVar1;
                                                    G->thunkpos = iVar2;
                                                    iVar3 = yymatchString(G,"so");
                                                    cclass = extraout_RDX_24;
                                                    if (iVar3 == 0) {
                                                      G->pos = iVar1;
                                                      G->thunkpos = iVar2;
                                                      iVar3 = yymatchString(G,"not");
                                                      cclass = extraout_RDX_25;
                                                      if (iVar3 == 0) {
                                                        G->pos = iVar1;
                                                        G->thunkpos = iVar2;
                                                        iVar3 = yymatchString(G,"andthen");
                                                        cclass = extraout_RDX_26;
                                                        if (iVar3 == 0) {
                                                          G->pos = iVar1;
                                                          G->thunkpos = iVar2;
                                                          iVar3 = yymatchString(G,"and");
                                                          cclass = extraout_RDX_27;
                                                          if (iVar3 == 0) {
                                                            G->pos = iVar1;
                                                            G->thunkpos = iVar2;
                                                            iVar3 = yymatchString(G,"or");
                                                            iVar5 = (uint)(iVar3 == 0) << 5;
                                                            cclass = extraout_RDX_28;
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (iVar5 == 0) {
LAB_0010bce4:
    iVar3 = G->pos;
    iVar5 = G->thunkpos;
    iVar4 = yymatchClass(G,(uchar *)"",cclass);
    if (iVar4 == 0) {
      iVar4 = 1;
      goto LAB_0010bd0e;
    }
  }
  else if (iVar5 != 0x20) {
    if (iVar5 != 3) {
      return iVar3;
    }
    goto LAB_0010bce4;
  }
  iVar4 = 0;
  iVar3 = iVar1;
  iVar5 = iVar2;
LAB_0010bd0e:
  G->pos = iVar3;
  G->thunkpos = iVar5;
  return iVar4;
}

Assistant:

YY_RULE(int) yy_reserved(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "reserved"));

  {  int yypos614= G->pos, yythunkpos614= G->thunkpos;  if (!yymatchString(G, "True")) goto l615;
  goto l614;
  l615:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "False")) goto l616;
  goto l614;
  l616:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "pi")) goto l617;
  goto l614;
  l617:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "my")) goto l618;
  goto l614;
  l618:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "our")) goto l619;
  goto l614;
  l619:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "until")) goto l620;
  goto l614;
  l620:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "while")) goto l621;
  goto l614;
  l621:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "unless")) goto l622;
  goto l614;
  l622:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "if")) goto l623;
  goto l614;
  l623:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "elsif")) goto l624;
  goto l614;
  l624:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "else")) goto l625;
  goto l614;
  l625:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "role")) goto l626;
  goto l614;
  l626:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "class")) goto l627;
  goto l614;
  l627:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "try")) goto l628;
  goto l614;
  l628:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "has")) goto l629;
  goto l614;
  l629:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "sub")) goto l630;
  goto l614;
  l630:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "cmp")) goto l631;
  goto l614;
  l631:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "enum")) goto l632;
  goto l614;
  l632:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchChar(G, 'e')) goto l633;
  goto l614;
  l633:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "time")) goto l634;
  goto l614;
  l634:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "now")) goto l635;
  goto l614;
  l635:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "rand")) goto l636;
  goto l614;
  l636:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "END")) goto l637;
  goto l614;
  l637:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "BEGIN")) goto l638;
  goto l614;
  l638:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchChar(G, 'Z')) goto l639;
  goto l614;
  l639:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "so")) goto l640;
  goto l614;
  l640:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "not")) goto l641;
  goto l614;
  l641:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "andthen")) goto l642;
  goto l614;
  l642:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "and")) goto l643;
  goto l614;
  l643:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "or")) goto l613;

  }
  l614:;	
  {  int yypos644= G->pos, yythunkpos644= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-A-Za-z0-9")) goto l644;
  goto l613;
  l644:;	  G->pos= yypos644; G->thunkpos= yythunkpos644;
  }  yyprintf((stderr, "  ok   reserved"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l613:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "reserved"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}